

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.cpp
# Opt level: O2

size_t __thiscall ezc3d::ParametersNS::Parameters::groupIdx(Parameters *this,string *groupName)

{
  int iVar1;
  Group *this_00;
  string *psVar2;
  invalid_argument *this_01;
  size_t i;
  ulong idx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  idx = 0;
  while( true ) {
    if ((ulong)(((long)(this->_groups).
                       super__Vector_base<ezc3d::ParametersNS::GroupNS::Group,_std::allocator<ezc3d::ParametersNS::GroupNS::Group>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->_groups).
                      super__Vector_base<ezc3d::ParametersNS::GroupNS::Group,_std::allocator<ezc3d::ParametersNS::GroupNS::Group>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x60) <= idx) {
      this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::operator+(&bStack_48,"Parameters::groupIdx could not find ",groupName);
      std::invalid_argument::invalid_argument(this_01,(string *)&bStack_48);
      __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    this_00 = group(this,idx);
    psVar2 = GroupNS::Group::name_abi_cxx11_(this_00);
    iVar1 = std::__cxx11::string::compare((string *)psVar2);
    if (iVar1 == 0) break;
    idx = idx + 1;
  }
  return idx;
}

Assistant:

size_t
ezc3d::ParametersNS::Parameters::groupIdx(const std::string &groupName) const {
  for (size_t i = 0; i < nbGroups(); ++i)
    if (!group(i).name().compare(groupName))
      return i;
  throw std::invalid_argument("Parameters::groupIdx could not find " +
                              groupName);
}